

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O0

seconds __thiscall TimeOffsets::Median(TimeOffsets *this)

{
  size_type sVar1;
  reference pvVar2;
  AnnotatedMixin<std::mutex> *in_RDI;
  long in_FS_OFFSET;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  sorted_copy;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_fffffffffffffef8;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_ffffffffffffff00;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_ffffffffffffff08;
  _Deque_iterator<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*>
  *__last;
  undefined8 in_stack_ffffffffffffff18;
  _Deque_iterator<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*>
  *__first;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_stack_ffffffffffffff40;
  _Deque_iterator<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*>
  local_90;
  _Deque_iterator<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*>
  local_70 [2];
  rep local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffef8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_RDI,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
  sVar1 = std::
          deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          ::size(in_stack_fffffffffffffef8);
  if (sVar1 < 5) {
    local_20 = (rep)s<(char)48>();
  }
  else {
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::deque(in_stack_ffffffffffffff40,
            (deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    __first = &local_90;
    __last = local_70;
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::begin(in_stack_ffffffffffffff00);
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::end(in_stack_ffffffffffffff00);
    std::
    sort<std::_Deque_iterator<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1l>>&,std::chrono::duration<long,std::ratio<1l,1l>>*>>
              (__first,__last);
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::size(in_stack_fffffffffffffef8);
    pvVar2 = std::
             deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             ::operator[](in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
    local_20 = pvVar2->__r;
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~deque(in_stack_ffffffffffffff08);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (seconds)local_20;
  }
  __stack_chk_fail();
}

Assistant:

std::chrono::seconds TimeOffsets::Median() const
{
    LOCK(m_mutex);

    // Only calculate the median if we have 5 or more offsets
    if (m_offsets.size() < 5) return 0s;

    auto sorted_copy = m_offsets;
    std::sort(sorted_copy.begin(), sorted_copy.end());
    return sorted_copy[sorted_copy.size() / 2];  // approximate median is good enough, keep it simple
}